

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  Storage SVar1;
  IndexType IVar2;
  int extraout_EAX;
  int iVar3;
  TestNode *pTVar4;
  TestNode *node;
  undefined8 *puVar5;
  long *plVar6;
  DrawTest *this_00;
  ulong *puVar7;
  IndexType type;
  IndexType type_00;
  ulong uVar8;
  undefined8 uVar9;
  undefined4 *puVar10;
  long lVar11;
  string desc;
  string iterationDesc;
  string name;
  DrawTestSpec spec;
  string local_2e8;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  string local_288;
  TestNode *local_268;
  long *local_260;
  undefined8 local_258;
  long local_250;
  undefined8 uStack_248;
  string local_240;
  IndexGroup *local_220;
  TestNode *local_218;
  TestNode *local_210;
  long local_208;
  TestNode *local_200;
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"user_ptr",
             "user pointer");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_user_ptr","unaligned user pointer");
  local_268 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_268,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "buffer");
  genBasicSpec(&local_1f8,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,local_268);
  puVar10 = &DAT_01c1cdfc;
  lVar11 = 0;
  local_220 = this;
  local_218 = node;
  local_210 = pTVar4;
  do {
    local_1a8 = &local_198;
    pTVar4 = local_218;
    if ((&DAT_01c1cdf8)[lVar11 * 0x18] != '\0') {
      pTVar4 = local_210;
    }
    SVar1 = (&DAT_01c1cdf0)[lVar11 * 6];
    local_200 = (TestNode *)0x0;
    if ((&DAT_01c1cdf8)[lVar11 * 0x18] != '\0') {
      local_200 = local_268;
    }
    if (SVar1 == STORAGE_USER) {
      local_200 = pTVar4;
    }
    local_208 = lVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index_","");
    IVar2 = (&DAT_01c1cdf4)[lVar11 * 6];
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2e8,(DrawTestSpec *)(ulong)IVar2,type);
    uVar8 = 0xf;
    if (local_1a8 != &local_198) {
      uVar8 = local_198;
    }
    if (uVar8 < local_2e8._M_string_length + local_1a0) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        uVar9 = local_2e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_2e8._M_string_length + local_1a0) goto LAB_01264861;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_01264861:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2e8._M_dataplus._M_p)
      ;
    }
    local_260 = &local_250;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_250 = *plVar6;
      uStack_248 = puVar5[3];
    }
    else {
      local_250 = *plVar6;
      local_260 = (long *)*puVar5;
    }
    local_258 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    local_2c8 = local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"index ","");
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_288,(DrawTestSpec *)(ulong)IVar2,type_00);
    uVar8 = 0xf;
    if (local_2c8 != local_2b8) {
      uVar8 = local_2b8[0];
    }
    if (uVar8 < local_288._M_string_length + local_2c0) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar9 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_288._M_string_length + local_2c0) goto LAB_01264986;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2c8);
    }
    else {
LAB_01264986:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_288._M_dataplus._M_p)
      ;
    }
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_1a8 = &local_198;
    puVar7 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar7) {
      local_198 = *puVar7;
      lStack_190 = plVar6[3];
    }
    else {
      local_198 = *puVar7;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              (&local_240,(DrawTestSpec *)(ulong)SVar1,(Storage)local_1a0);
    uVar8 = 0xf;
    if (local_1a8 != &local_198) {
      uVar8 = local_198;
    }
    if (uVar8 < local_240._M_string_length + local_1a0) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        uVar9 = local_240.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_240._M_string_length + local_1a0) goto LAB_01264abd;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_01264abd:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_240._M_dataplus._M_p)
      ;
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_2e8.field_2._M_allocated_capacity = *puVar7;
      local_2e8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *puVar7;
      local_2e8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_2e8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)puVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(local_220->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_220->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_260,
               local_2e8._M_dataplus._M_p);
    lVar11 = 0;
    local_1f8.indexType = IVar2;
    local_1f8.indexStorage = SVar1;
    do {
      iVar3 = puVar10[lVar11];
      if (iVar3 == -1) break;
      local_2c8 = local_2b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"offset ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_2c8 != local_2b8) {
        uVar8 = local_2b8[0];
      }
      if (uVar8 < local_288._M_string_length + local_2c0) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          uVar9 = local_288.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_288._M_string_length + local_2c0) goto LAB_01264cb8;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2c8);
      }
      else {
LAB_01264cb8:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2c8,(ulong)local_288._M_dataplus._M_p);
      }
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_298 = *plVar6;
        uStack_290 = puVar5[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *plVar6;
        local_2a8 = (long *)*puVar5;
      }
      local_2a0 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)plVar6 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != local_2b8) {
        operator_delete(local_2c8,local_2b8[0] + 1);
      }
      local_1f8.indexPointerOffset = iVar3;
      deqp::gls::DrawTest::addIteration(this_00,&local_1f8,(char *)local_2a8);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    tcu::TestNode::addChild(local_200,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    lVar11 = local_208 + 1;
    puVar10 = puVar10 + 6;
    if (lVar11 == 8) {
      iVar3 = 8;
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_INT,	true,	{ 0, 4, -1 } },

		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_INT,	false,	{ 2, 3, -1 } },

		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_INT,	true,	{ 0, 4, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* userPtrGroup			= new tcu::TestCaseGroup(m_testCtx, "user_ptr", "user pointer");
	tcu::TestCaseGroup* unalignedUserPtrGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_user_ptr", "unaligned user pointer");
	tcu::TestCaseGroup* bufferGroup				= new tcu::TestCaseGroup(m_testCtx, "buffer", "buffer");

	genBasicSpec(spec, m_method);

	this->addChild(userPtrGroup);
	this->addChild(unalignedUserPtrGroup);
	this->addChild(bufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];
		tcu::TestCaseGroup*				group		= (indexTest.storage == gls::DrawTestSpec::STORAGE_USER)
													? ((indexTest.aligned) ? (userPtrGroup) : (unalignedUserPtrGroup))
													: ((indexTest.aligned) ? (bufferGroup) : (DE_NULL));

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET);
		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}